

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O1

int stbir__resize_arbitrary
              (void *alloc_context,void *input_data,int input_w,int input_h,
              int input_stride_in_bytes,void *output_data,int output_w,int output_h,
              int output_stride_in_bytes,float s0,float t0,float s1,float t1,float *transform,
              int channels,int alpha_channel,stbir_uint32 flags,stbir_datatype type,
              stbir_filter h_filter,stbir_filter v_filter,stbir_edge edge_horizontal,
              stbir_edge edge_vertical,stbir_colorspace colorspace)

{
  uint uVar1;
  float *pfVar2;
  void *pvVar3;
  int iVar4;
  float *pfVar5;
  float *encode_buffer;
  stbir_uint32 sVar6;
  stbir_uint32 sVar7;
  int iVar8;
  stbir__contributors *contributors;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined4 in_register_00000084;
  ulong uVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  double dVar25;
  float fVar26;
  float fVar27;
  undefined4 in_stack_0000001c;
  int local_188;
  stbir__info local_170;
  long local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  long local_40;
  stbir__contributors *local_38;
  
  pfVar2 = (float *)CONCAT44(in_stack_0000001c,output_stride_in_bytes);
  local_170.input_w = (int)input_data;
  local_170.output_w = (int)output_data;
  local_170.output_h = output_w;
  local_170.channels = (uint)transform;
  if (pfVar2 == (float *)0x0) {
    local_170.horizontal_scale = ((float)local_170.output_w / (float)local_170.input_w) / (s1 - s0);
    local_170.vertical_scale = ((float)output_w / (float)input_w) / (t1 - t0);
    local_170.horizontal_shift = ((float)local_170.output_w * s0) / (s1 - s0);
    local_170.vertical_shift = ((float)output_w * t0) / (t1 - t0);
  }
  else {
    local_170.horizontal_scale = *pfVar2;
    local_170.vertical_scale = pfVar2[1];
    local_170.horizontal_shift = pfVar2[2];
    local_170.vertical_shift = pfVar2[3];
  }
  local_170.horizontal_filter = local_170.horizontal_scale <= 1.0 | STBIR_MAX_TYPES;
  if (type != STBIR_TYPE_UINT8) {
    local_170.horizontal_filter = type;
  }
  local_170.vertical_filter = local_170.vertical_scale <= 1.0 | STBIR_FILTER_CATMULLROM;
  if (h_filter != STBIR_FILTER_DEFAULT) {
    local_170.vertical_filter = h_filter;
  }
  local_170.input_h = input_w;
  local_170.s0 = s0;
  local_170.t0 = t0;
  local_170.s1 = s1;
  local_170.t1 = t1;
  sVar6 = stbir__calculate_memory(&local_170);
  uVar20 = (ulong)sVar6;
  contributors = (stbir__contributors *)malloc(uVar20);
  if (contributors == (stbir__contributors *)0x0) {
    return 0;
  }
  sVar7 = stbir__calculate_memory(&local_170);
  if (input_h == 0) {
    input_h = (uint)"\x01\x02\x04\x04"[flags] * local_170.input_w * local_170.channels;
  }
  if (output_h == 0) {
    output_h = (uint)"\x01\x02\x04\x04"[flags] * local_170.output_w * local_170.channels;
  }
  if (local_170.channels < 0) {
    __assert_fail("info->channels >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                  ,0x909,
                  "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                 );
  }
  if (0x40 < local_170.channels) {
    __assert_fail("info->channels <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                  ,0x90a,
                  "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                 );
  }
  uVar18 = (ulong)local_170.horizontal_filter;
  if (5 < uVar18) {
    __assert_fail("info->horizontal_filter < (sizeof((stbir__filter_info_table))/sizeof((stbir__filter_info_table)[0]))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                  ,0x90f,
                  "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                 );
  }
  local_38 = contributors;
  if (STBIR_FILTER_MITCHELL < local_170.vertical_filter) {
    __assert_fail("info->vertical_filter < (sizeof((stbir__filter_info_table))/sizeof((stbir__filter_info_table)[0]))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                  ,0x910,
                  "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                 );
  }
  uVar1 = alpha_channel | 3;
  if (-1 < channels) {
    uVar1 = alpha_channel;
  }
  if ((uint)local_170.channels <= (uint)channels && (~uVar1 & 3) != 0) {
    __assert_fail("alpha_channel >= 0 && alpha_channel < info->channels",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                  ,0x91b,
                  "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                 );
  }
  iVar15 = 0;
  if (channels < local_170.channels) {
    if (sVar6 < sVar7) {
      __assert_fail("tempmem_size_in_bytes >= memory_required",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                    ,0x926,
                    "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                   );
    }
    memset(contributors,0,uVar20);
    local_170.alpha_channel = channels;
    local_170.type = flags;
    local_170.edge_horizontal = v_filter;
    local_170.edge_vertical = edge_horizontal;
    local_170.colorspace = edge_vertical;
    local_170.input_data = alloc_context;
    local_170.input_stride_bytes = input_h;
    local_170.output_data = (void *)CONCAT44(in_register_00000084,input_stride_in_bytes);
    local_170.output_stride_bytes = output_h;
    local_170.flags = uVar1;
    fVar23 = (*stbir__filter_info_table[uVar18].support)
                       ((float)(-(uint)(local_170.horizontal_scale <= 1.0) &
                                (uint)local_170.horizontal_scale |
                               ~-(uint)(local_170.horizontal_scale <= 1.0) &
                               (uint)(1.0 / local_170.horizontal_scale)));
    fVar23 = ceilf(fVar23 + fVar23);
    local_170.horizontal_coefficient_width = (int)fVar23;
    fVar23 = (*stbir__filter_info_table[local_170.vertical_filter].support)
                       ((float)(-(uint)(local_170.vertical_scale <= 1.0) &
                                (uint)local_170.vertical_scale |
                               ~-(uint)(local_170.vertical_scale <= 1.0) &
                               (uint)(1.0 / local_170.vertical_scale)));
    fVar23 = ceilf(fVar23 + fVar23);
    local_170.vertical_coefficient_width = (int)fVar23;
    local_170.horizontal_filter_pixel_width =
         stbir__get_filter_pixel_width(local_170.horizontal_filter,local_170.horizontal_scale);
    local_170.vertical_filter_pixel_width =
         stbir__get_filter_pixel_width(local_170.vertical_filter,local_170.vertical_scale);
    local_170.horizontal_filter_pixel_margin =
         stbir__get_filter_pixel_width(local_170.horizontal_filter,local_170.horizontal_scale);
    local_170.horizontal_filter_pixel_margin = local_170.horizontal_filter_pixel_margin / 2;
    local_170.vertical_filter_pixel_margin =
         stbir__get_filter_pixel_width(local_170.vertical_filter,local_170.vertical_scale);
    local_170.vertical_filter_pixel_margin = local_170.vertical_filter_pixel_margin / 2;
    local_170.ring_buffer_length_bytes = local_170.channels * local_170.output_w * 4;
    local_170.decode_buffer_pixels =
         local_170.input_w + local_170.horizontal_filter_pixel_margin * 2;
    local_170.horizontal_coefficients =
         (float *)((long)&contributors->n0 + (long)local_170.horizontal_contributors_size);
    local_170.vertical_contributors =
         (stbir__contributors *)
         ((long)local_170.horizontal_coefficients_size + (long)local_170.horizontal_coefficients);
    local_170.vertical_coefficients =
         (float *)((long)&(local_170.vertical_contributors)->n0 +
                  (long)local_170.vertical_contributors_size);
    local_170.decode_buffer =
         (float *)((long)local_170.vertical_coefficients_size +
                  (long)local_170.vertical_coefficients);
    lVar13 = (long)&contributors->n0 + uVar20;
    local_170.horizontal_contributors = contributors;
    if (1.0 < local_170.vertical_scale) {
      local_170.horizontal_buffer = (float *)0x0;
      local_170.ring_buffer =
           (float *)((long)local_170.decode_buffer + (long)local_170.decode_buffer_size);
      local_170.encode_buffer =
           (float *)((long)local_170.ring_buffer_size + (long)local_170.ring_buffer);
      if (lVar13 != (long)local_170.encode_buffer_size + (long)local_170.encode_buffer) {
        __assert_fail("(size_t)(unsigned char*)(((unsigned char*)info->encode_buffer) + info->encode_buffer_size) == (size_t)tempmem + tempmem_size_in_bytes"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x952,
                      "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                     );
      }
    }
    else {
      local_170.horizontal_buffer =
           (float *)((long)local_170.decode_buffer + (long)local_170.decode_buffer_size);
      local_170.ring_buffer =
           (float *)((long)local_170.horizontal_buffer_size + (long)local_170.horizontal_buffer);
      local_170.encode_buffer = (float *)0x0;
      if (lVar13 != (long)local_170.ring_buffer_size + (long)local_170.ring_buffer) {
        __assert_fail("(size_t)(unsigned char*)(((unsigned char*)info->ring_buffer) + info->ring_buffer_size) == (size_t)tempmem + tempmem_size_in_bytes"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x95a,
                      "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                     );
      }
    }
    local_170.ring_buffer_begin_index = -1;
    stbir__calculate_filters
              (contributors,local_170.horizontal_coefficients,local_170.horizontal_filter,
               local_170.horizontal_scale,local_170.horizontal_shift,local_170.input_w,
               local_170.output_w);
    stbir__calculate_filters
              (local_170.vertical_contributors,local_170.vertical_coefficients,
               local_170.vertical_filter,local_170.vertical_scale,local_170.vertical_shift,
               local_170.input_h,local_170.output_h);
    fVar23 = local_170.vertical_scale;
    iVar15 = local_170.output_h;
    if (1.0 < local_170.vertical_scale) {
      fVar24 = (*stbir__filter_info_table[local_170.vertical_filter].support)
                         (1.0 / local_170.vertical_scale);
      if (local_170.vertical_scale <= 1.0) {
        __assert_fail("stbir__use_height_upsampling(stbir_info)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x816,"void stbir__buffer_loop_upsample(stbir__info *)");
      }
      iVar15 = 1;
      if (local_170.output_h < 1) goto LAB_00136002;
      lVar13 = 0;
      do {
        fVar26 = (float)(int)lVar13 + 0.5;
        fVar27 = fVar24 * fVar23 + fVar26 + local_170.vertical_shift;
        dVar25 = floor((double)(((fVar26 - fVar24 * fVar23) + local_170.vertical_shift) / fVar23) +
                       0.5);
        iVar15 = (int)dVar25;
        dVar25 = floor((double)(fVar27 / fVar23) + -0.5);
        if (local_170.ring_buffer_num_entries <= (int)dVar25 - iVar15) {
          __assert_fail("in_last_scanline - in_first_scanline + 1 <= stbir_info->ring_buffer_num_entries"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x81f,"void stbir__buffer_loop_upsample(stbir__info *)");
        }
        if ((-1 < local_170.ring_buffer_begin_index) &&
           (local_170.ring_buffer_first_scanline < iVar15)) {
          iVar9 = local_170.ring_buffer_last_scanline;
          iVar8 = local_170.ring_buffer_first_scanline;
          do {
            iVar8 = iVar8 + 1;
            if (iVar8 - iVar9 == 1) {
              local_170.ring_buffer_begin_index = -1;
              local_170.ring_buffer_first_scanline = 0;
              local_170.ring_buffer_last_scanline = 0;
              break;
            }
            local_170.ring_buffer_first_scanline = iVar8;
            local_170.ring_buffer_begin_index =
                 (local_170.ring_buffer_begin_index + 1) % local_170.ring_buffer_num_entries;
          } while (iVar8 != iVar15);
        }
        if (-1 < local_170.ring_buffer_begin_index) goto LAB_00135aee;
        while( true ) {
          stbir__decode_and_resample_upsample(&local_170,iVar15);
LAB_00135aee:
          encode_buffer = local_170.encode_buffer;
          pfVar5 = local_170.ring_buffer;
          iVar10 = local_170.ring_buffer_begin_index;
          iVar16 = local_170.ring_buffer_num_entries;
          pfVar2 = local_170.vertical_coefficients;
          iVar9 = local_170.alpha_channel;
          iVar8 = local_170.channels;
          iVar15 = local_170.output_w;
          pvVar3 = local_170.output_data;
          if ((int)dVar25 <= local_170.ring_buffer_last_scanline) break;
          iVar15 = local_170.ring_buffer_last_scanline + 1;
        }
        if (local_170.vertical_scale <= 1.0) {
          __assert_fail("stbir__use_height_upsampling(stbir_info)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x76a,"void stbir__resample_vertical_upsample(stbir__info *, int)");
        }
        lVar17 = (long)local_170.output_w;
        uVar18 = (ulong)(uint)local_170.output_w;
        uVar20 = (ulong)(uint)local_170.channels;
        local_48 = (float *)(ulong)local_170.type;
        local_50 = (float *)(ulong)local_170.colorspace;
        iVar11 = local_170.ring_buffer_length_bytes >> 2;
        local_58 = (float *)(long)(int)lVar13;
        lVar14 = (long)local_170.vertical_coefficient_width * (long)local_58;
        iVar12 = local_170.vertical_contributors[lVar13].n1;
        iVar22 = local_170.vertical_contributors[lVar13].n0;
        iVar4 = local_170.ring_buffer_first_scanline;
        local_60 = (long)local_170.output_stride_bytes;
        local_40 = lVar13;
        memset(local_170.encode_buffer,0,lVar17 * local_170.channels * 4);
        local_188 = (int)lVar14;
        switch(iVar8) {
        case 1:
          if (iVar22 <= iVar12) {
            iVar12 = iVar12 - iVar22;
            uVar20 = 0;
            do {
              if (0 < iVar15) {
                fVar26 = pfVar2[(long)local_188 + uVar20];
                uVar21 = 0;
                do {
                  encode_buffer[uVar21] =
                       pfVar5[(long)((((iVar10 - iVar4) + iVar22) % iVar16) * iVar11) + uVar21] *
                       fVar26 + encode_buffer[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar18 != uVar21);
              }
              uVar20 = uVar20 + 1;
              iVar22 = iVar22 + 1;
            } while (uVar20 != iVar12 + 1);
          }
          break;
        case 2:
          if (iVar22 <= iVar12) {
            iVar12 = iVar12 - iVar22;
            uVar20 = 0;
            do {
              if (0 < iVar15) {
                lVar13 = (long)((((iVar10 - iVar4) + iVar22) % iVar16) * iVar11);
                fVar26 = pfVar2[(long)local_188 + uVar20];
                uVar21 = 0;
                do {
                  encode_buffer[uVar21 * 2] =
                       pfVar5[lVar13 + uVar21 * 2] * fVar26 + encode_buffer[uVar21 * 2];
                  encode_buffer[uVar21 * 2 + 1] =
                       pfVar5[lVar13 + uVar21 * 2 + 1] * fVar26 + encode_buffer[uVar21 * 2 + 1];
                  uVar21 = uVar21 + 1;
                } while (uVar18 != uVar21);
              }
              uVar20 = uVar20 + 1;
              iVar22 = iVar22 + 1;
            } while (uVar20 != iVar12 + 1);
          }
          break;
        case 3:
          if (iVar22 <= iVar12) {
            iVar12 = iVar12 - iVar22;
            uVar20 = 0;
            do {
              if (0 < iVar15) {
                fVar26 = pfVar2[(long)local_188 + uVar20];
                lVar13 = (long)((((iVar10 - iVar4) + iVar22) % iVar16) * iVar11) * 4;
                lVar14 = 0;
                do {
                  *(float *)((long)encode_buffer + lVar14) =
                       *(float *)((long)pfVar5 + lVar14 + lVar13) * fVar26 +
                       *(float *)((long)encode_buffer + lVar14);
                  *(float *)((long)encode_buffer + lVar14 + 4) =
                       *(float *)((long)pfVar5 + lVar14 + lVar13 + 4) * fVar26 +
                       *(float *)((long)encode_buffer + lVar14 + 4);
                  *(float *)((long)encode_buffer + lVar14 + 8) =
                       *(float *)((long)pfVar5 + lVar14 + lVar13 + 8) * fVar26 +
                       *(float *)((long)encode_buffer + lVar14 + 8);
                  lVar14 = lVar14 + 0xc;
                } while (uVar18 * 0xc != lVar14);
              }
              uVar20 = uVar20 + 1;
              iVar22 = iVar22 + 1;
            } while (uVar20 != iVar12 + 1);
          }
          break;
        case 4:
          if (iVar22 <= iVar12) {
            iVar12 = iVar12 - iVar22;
            uVar20 = 0;
            do {
              if (0 < iVar15) {
                fVar26 = pfVar2[lVar14 + uVar20];
                lVar13 = (long)((((iVar10 - iVar4) + iVar22) % iVar16) * iVar11) * 4;
                lVar17 = 0;
                do {
                  *(float *)((long)encode_buffer + lVar17) =
                       *(float *)((long)pfVar5 + lVar17 + lVar13) * fVar26 +
                       *(float *)((long)encode_buffer + lVar17);
                  *(float *)((long)encode_buffer + lVar17 + 4) =
                       *(float *)((long)pfVar5 + lVar17 + lVar13 + 4) * fVar26 +
                       *(float *)((long)encode_buffer + lVar17 + 4);
                  *(float *)((long)encode_buffer + lVar17 + 8) =
                       *(float *)((long)pfVar5 + lVar17 + lVar13 + 8) * fVar26 +
                       *(float *)((long)encode_buffer + lVar17 + 8);
                  *(float *)((long)encode_buffer + lVar17 + 0xc) =
                       *(float *)((long)pfVar5 + lVar17 + lVar13 + 0xc) * fVar26 +
                       *(float *)((long)encode_buffer + lVar17 + 0xc);
                  lVar17 = lVar17 + 0x10;
                } while (uVar18 << 4 != lVar17);
              }
              uVar20 = uVar20 + 1;
              iVar22 = iVar22 + 1;
            } while (uVar20 != iVar12 + 1);
          }
          break;
        default:
          if (iVar22 <= iVar12) {
            iVar12 = iVar12 - iVar22;
            uVar18 = 0;
            do {
              if (0 < iVar15) {
                fVar26 = pfVar2[(long)local_188 + uVar18];
                uVar21 = 0;
                lVar13 = 0;
                do {
                  if (0 < iVar8) {
                    uVar19 = 0;
                    do {
                      encode_buffer[uVar21 + uVar19] =
                           pfVar5[(long)((((iVar10 - iVar4) + iVar22) % iVar16) * iVar11) +
                                  uVar21 + uVar19] * fVar26 + encode_buffer[uVar21 + uVar19];
                      uVar19 = uVar19 + 1;
                    } while (uVar20 != uVar19);
                  }
                  lVar13 = lVar13 + 1;
                  uVar21 = (ulong)(uint)((int)uVar21 + iVar8);
                } while (lVar13 != lVar17);
              }
              uVar18 = uVar18 + 1;
              iVar22 = iVar22 + 1;
            } while (uVar18 != iVar12 + 1);
          }
        }
        stbir__encode_scanline
                  (&local_170,iVar15,(void *)((long)pvVar3 + local_60 * (long)local_58),
                   encode_buffer,iVar8,iVar9,(int)local_50 + (int)local_48 * 2);
        lVar13 = local_40 + 1;
      } while (lVar13 < local_170.output_h);
    }
    else {
      fVar24 = (*stbir__filter_info_table[local_170.vertical_filter].support)
                         (local_170.vertical_scale);
      if (1.0 < local_170.vertical_scale) {
        __assert_fail("!stbir__use_height_upsampling(stbir_info)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x87b,"void stbir__buffer_loop_downsample(stbir__info *)");
      }
      iVar9 = local_170.input_h + local_170.vertical_filter_pixel_margin;
      iVar8 = -local_170.vertical_filter_pixel_margin;
      local_60 = CONCAT44(local_60._4_4_,iVar9);
      if (iVar9 != iVar8 &&
          SBORROW4(iVar9,iVar8) == iVar9 + local_170.vertical_filter_pixel_margin < 0) {
        do {
          fVar26 = (fVar24 / fVar23 + (float)iVar8 + 0.5) * fVar23 - local_170.vertical_shift;
          dVar25 = floor((double)((((float)iVar8 + 0.5) - fVar24 / fVar23) * fVar23 -
                                 local_170.vertical_shift) + 0.5);
          iVar16 = (int)dVar25;
          dVar25 = floor((double)fVar26 + -0.5);
          iVar9 = (int)dVar25;
          if (local_170.ring_buffer_num_entries <= iVar9 - iVar16) {
            __assert_fail("out_last_scanline - out_first_scanline + 1 <= stbir_info->ring_buffer_num_entries"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                          ,0x884,"void stbir__buffer_loop_downsample(stbir__info *)");
          }
          if ((-1 < iVar9) && (iVar16 < iVar15)) {
            stbir__empty_ring_buffer(&local_170,iVar16);
            stbir__decode_scanline(&local_170,iVar8);
            memset(local_170.horizontal_buffer,0,
                   (long)local_170.channels * (long)local_170.output_w * 4);
            if (1.0 < local_170.horizontal_scale) {
              stbir__resample_horizontal_upsample(&local_170,local_170.horizontal_buffer);
            }
            else {
              stbir__resample_horizontal_downsample(&local_170,local_170.horizontal_buffer);
            }
            if (-1 < local_170.ring_buffer_begin_index) goto LAB_0013566f;
            while( true ) {
              stbir__add_empty_ring_buffer_entry(&local_170,iVar16);
LAB_0013566f:
              if (iVar9 <= local_170.ring_buffer_last_scanline) break;
              iVar16 = local_170.ring_buffer_last_scanline + 1;
            }
            if (1.0 < local_170.vertical_scale) {
              __assert_fail("!stbir__use_height_upsampling(stbir_info)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                            ,0x7d5,"void stbir__resample_vertical_downsample(stbir__info *, int)");
            }
            lVar13 = (long)iVar8 + (long)local_170.vertical_filter_pixel_margin;
            iVar9 = local_170.vertical_contributors[lVar13].n0;
            iVar16 = local_170.vertical_contributors[lVar13].n1;
            if (iVar9 <= iVar16) {
              uVar20 = (ulong)(uint)local_170.output_w;
              local_40 = CONCAT44(local_40._4_4_,local_170.ring_buffer_length_bytes >> 2);
              iVar10 = (int)lVar13 * local_170.vertical_coefficient_width - iVar9;
              local_48 = local_170.ring_buffer + 3;
              local_50 = local_170.ring_buffer + 2;
              local_58 = local_170.ring_buffer + 1;
              do {
                fVar26 = local_170.vertical_coefficients[iVar10 + iVar9];
                lVar13 = (long)((((local_170.ring_buffer_begin_index -
                                  local_170.ring_buffer_first_scanline) + iVar9) %
                                local_170.ring_buffer_num_entries) *
                               (local_170.ring_buffer_length_bytes >> 2));
                switch(local_170.channels) {
                case 1:
                  if (0 < local_170.output_w) {
                    uVar18 = 0;
                    do {
                      local_170.ring_buffer[lVar13 + uVar18] =
                           local_170.horizontal_buffer[uVar18] * fVar26 +
                           local_170.ring_buffer[lVar13 + uVar18];
                      uVar18 = uVar18 + 1;
                    } while (uVar20 != uVar18);
                  }
                  break;
                case 2:
                  if (0 < local_170.output_w) {
                    uVar18 = 0;
                    do {
                      local_58[lVar13 + uVar18 * 2 + -1] =
                           local_170.horizontal_buffer[uVar18 * 2] * fVar26 +
                           local_58[lVar13 + uVar18 * 2 + -1];
                      local_58[lVar13 + uVar18 * 2] =
                           local_170.horizontal_buffer[uVar18 * 2 + 1] * fVar26 +
                           local_58[lVar13 + uVar18 * 2];
                      uVar18 = uVar18 + 1;
                    } while (uVar20 != uVar18);
                  }
                  break;
                case 3:
                  if (0 < local_170.output_w) {
                    lVar14 = 0;
                    do {
                      *(float *)((long)local_50 + lVar14 + lVar13 * 4 + -8) =
                           *(float *)((long)local_170.horizontal_buffer + lVar14) * fVar26 +
                           *(float *)((long)local_50 + lVar14 + lVar13 * 4 + -8);
                      *(float *)((long)local_50 + lVar14 + lVar13 * 4 + -4) =
                           *(float *)((long)local_170.horizontal_buffer + lVar14 + 4) * fVar26 +
                           *(float *)((long)local_50 + lVar14 + lVar13 * 4 + -4);
                      *(float *)((long)local_50 + lVar14 + lVar13 * 4) =
                           *(float *)((long)local_170.horizontal_buffer + lVar14 + 8) * fVar26 +
                           *(float *)((long)local_50 + lVar14 + lVar13 * 4);
                      lVar14 = lVar14 + 0xc;
                    } while (uVar20 * 0xc != lVar14);
                  }
                  break;
                case 4:
                  if (0 < local_170.output_w) {
                    lVar14 = 0;
                    do {
                      *(float *)((long)local_48 + lVar14 + lVar13 * 4 + -0xc) =
                           *(float *)((long)local_170.horizontal_buffer + lVar14) * fVar26 +
                           *(float *)((long)local_48 + lVar14 + lVar13 * 4 + -0xc);
                      *(float *)((long)local_48 + lVar14 + lVar13 * 4 + -8) =
                           *(float *)((long)local_170.horizontal_buffer + lVar14 + 4) * fVar26 +
                           *(float *)((long)local_48 + lVar14 + lVar13 * 4 + -8);
                      *(float *)((long)local_48 + lVar14 + lVar13 * 4 + -4) =
                           *(float *)((long)local_170.horizontal_buffer + lVar14 + 8) * fVar26 +
                           *(float *)((long)local_48 + lVar14 + lVar13 * 4 + -4);
                      *(float *)((long)local_48 + lVar14 + lVar13 * 4) =
                           *(float *)((long)local_170.horizontal_buffer + lVar14 + 0xc) * fVar26 +
                           *(float *)((long)local_48 + lVar14 + lVar13 * 4);
                      lVar14 = lVar14 + 0x10;
                    } while (uVar20 << 4 != lVar14);
                  }
                  break;
                default:
                  if (0 < local_170.output_w) {
                    uVar18 = 0;
                    uVar21 = 0;
                    do {
                      if (0 < local_170.channels) {
                        uVar19 = 0;
                        do {
                          local_170.ring_buffer[lVar13 + uVar18 + uVar19] =
                               local_170.horizontal_buffer[uVar18 + uVar19] * fVar26 +
                               local_170.ring_buffer[lVar13 + uVar18 + uVar19];
                          uVar19 = uVar19 + 1;
                        } while ((uint)local_170.channels != uVar19);
                      }
                      uVar21 = uVar21 + 1;
                      uVar18 = (ulong)(uint)((int)uVar18 + local_170.channels);
                    } while (uVar21 != uVar20);
                  }
                }
                iVar9 = iVar9 + 1;
              } while (iVar16 + 1 != iVar9);
            }
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 != (int)local_60);
      }
      stbir__empty_ring_buffer(&local_170,local_170.output_h);
    }
    iVar15 = 1;
  }
LAB_00136002:
  free(local_38);
  return iVar15;
}

Assistant:

static int stbir__resize_arbitrary(
    void *alloc_context,
    const void* input_data, int input_w, int input_h, int input_stride_in_bytes,
    void* output_data, int output_w, int output_h, int output_stride_in_bytes,
    float s0, float t0, float s1, float t1, float *transform,
    int channels, int alpha_channel, stbir_uint32 flags, stbir_datatype type,
    stbir_filter h_filter, stbir_filter v_filter,
    stbir_edge edge_horizontal, stbir_edge edge_vertical, stbir_colorspace colorspace)
{
    stbir__info info;
    int result;
    size_t memory_required;
    void* extra_memory;

    stbir__setup(&info, input_w, input_h, output_w, output_h, channels);
    stbir__calculate_transform(&info, s0,t0,s1,t1,transform);
    stbir__choose_filter(&info, h_filter, v_filter);
    memory_required = stbir__calculate_memory(&info);
    extra_memory = STBIR_MALLOC(memory_required, alloc_context);

    if (!extra_memory)
        return 0;

    result = stbir__resize_allocated(&info, input_data, input_stride_in_bytes,
                                            output_data, output_stride_in_bytes,
                                            alpha_channel, flags, type,
                                            edge_horizontal, edge_vertical,
                                            colorspace, extra_memory, memory_required);

    STBIR_FREE(extra_memory, alloc_context);

    return result;
}